

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeglobals.cpp
# Opt level: O0

void __thiscall QMakeGlobals::QMakeGlobals(QMakeGlobals *this)

{
  QChar *in_RDI;
  long in_FS_OFFSET;
  QChar *pQVar1;
  QLatin1Char ch;
  QChar *local_20;
  QLatin1Char local_f;
  QChar local_e;
  QLatin1Char local_b;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)0x30a98e);
  QString::QString((QString *)0x30a99c);
  QString::QString((QString *)0x30a9aa);
  QString::QString((QString *)0x30a9b8);
  QList<QString>::QList((QList<QString> *)0x30a9c6);
  QList<QString>::QList((QList<QString> *)0x30a9d7);
  QString::QString((QString *)0x30a9e8);
  QString::QString((QString *)0x30a9f9);
  QString::QString((QString *)0x30aa0a);
  QString::QString((QString *)0x30aa1b);
  QString::QString((QString *)0x30aa2c);
  local_20 = in_RDI + 0x88;
  pQVar1 = in_RDI + 0xb8;
  do {
    QString::QString((QString *)0x30aa56);
    local_20 = local_20 + 0xc;
  } while (local_20 != pQVar1);
  QString::QString((QString *)0x30aa7e);
  ch.ch = (char)((ulong)pQVar1 >> 0x38);
  QString::QString((QString *)0x30aa8f);
  QHash<QMakeBaseKey,_QMakeBaseEnv_*>::QHash((QHash<QMakeBaseKey,_QMakeBaseEnv_*> *)(in_RDI + 0xd8))
  ;
  *(undefined1 *)&in_RDI->ucs = 1;
  *(undefined4 *)(in_RDI + 0xb8) = 0;
  QLatin1Char::QLatin1Char(&local_b,':');
  QChar::QChar<QLatin1Char,_true>(in_RDI,ch);
  QString::operator=((QString *)(in_RDI + 0x10),local_a);
  QLatin1Char::QLatin1Char(&local_f,'/');
  QChar::QChar<QLatin1Char,_true>(in_RDI,ch);
  QString::operator=((QString *)(in_RDI + 4),local_e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMakeGlobals::QMakeGlobals()
{
    do_cache = true;

#ifdef PROEVALUATOR_DEBUG
    debugLevel = 0;
#endif
#ifdef Q_OS_WIN
    dirlist_sep = QLatin1Char(';');
    dir_sep = QLatin1Char('\\');
#else
    dirlist_sep = QLatin1Char(':');
    dir_sep = QLatin1Char('/');
#endif
}